

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::AssignDescriptorsHelper::AssignMessageDescriptor
          (AssignDescriptorsHelper *this,Descriptor *descriptor)

{
  Descriptor *descriptor_00;
  undefined4 extraout_var;
  ClassDataFull *pCVar1;
  DescriptorPool *pool;
  Reflection *pRVar2;
  EnumDescriptor *pEVar3;
  int i;
  int iVar4;
  int local_d4;
  Reflection *local_d0;
  MigrationSchema local_c8;
  int bit;
  uint32_t bits;
  ReflectionSchema result;
  uint32_t *local_70;
  anon_class_24_3_9b4dbb1a local_68;
  anon_class_32_4_d31a86ec next;
  
  for (iVar4 = 0; iVar4 < descriptor->nested_type_count_; iVar4 = iVar4 + 1) {
    descriptor_00 = Descriptor::nested_type(descriptor,iVar4);
    AssignMessageDescriptor(this,descriptor_00);
  }
  if (*this->default_instance_data_ != (Message *)0x0) {
    iVar4 = (*((*this->default_instance_data_)->super_MessageLite)._vptr_MessageLite[4])();
    pCVar1 = internal::ClassData::full((ClassData *)CONCAT44(extraout_var,iVar4));
    if (pCVar1->descriptor_table != (DescriptorTable *)0x0) {
      pCVar1->descriptor = descriptor;
      local_d0 = (Reflection *)operator_new(0x70);
      local_70 = this->offsets_;
      local_c8 = *this->schemas_;
      local_68.migration_schema = &local_c8;
      local_68.offsets = &local_70;
      result.default_instance_ = *this->default_instance_data_;
      local_d4 = local_c8.offsets_index + 1;
      next.index = &local_d4;
      bits = local_70[local_c8.offsets_index];
      next.bits = &bits;
      next.bit = &bit;
      bit = 0;
      local_68.next = &next;
      next.offsets = local_68.offsets;
      result.has_bits_offset_ =
           anon_unknown_6::MigrationToReflectionSchema::anon_class_32_4_d31a86ec::operator()(&next);
      result.extensions_offset_ =
           anon_unknown_6::MigrationToReflectionSchema::anon_class_32_4_d31a86ec::operator()(&next);
      result.oneof_case_offset_ =
           anon_unknown_6::MigrationToReflectionSchema::anon_class_32_4_d31a86ec::operator()(&next);
      result.weak_field_map_offset_ =
           anon_unknown_6::MigrationToReflectionSchema::anon_class_32_4_d31a86ec::operator()(&next);
      result.inlined_string_donated_offset_ =
           anon_unknown_6::MigrationToReflectionSchema::anon_class_32_4_d31a86ec::operator()(&next);
      result.split_offset_ =
           anon_unknown_6::MigrationToReflectionSchema::anon_class_32_4_d31a86ec::operator()(&next);
      result.sizeof_split_ =
           anon_unknown_6::MigrationToReflectionSchema::anon_class_32_4_d31a86ec::operator()(&next);
      result.has_bit_indices_ =
           anon_unknown_6::MigrationToReflectionSchema::anon_class_24_3_9b4dbb1a::operator()
                     (&local_68);
      result.inlined_string_indices_ =
           anon_unknown_6::MigrationToReflectionSchema::anon_class_24_3_9b4dbb1a::operator()
                     (&local_68);
      pRVar2 = local_d0;
      result.offsets_ = local_70 + local_d4;
      result.object_size_ = local_c8.object_size;
      pool = DescriptorPool::internal_generated_pool();
      Reflection::Reflection(pRVar2,descriptor,&result,pool,this->factory_);
      pRVar2 = internal::OnShutdownDelete<google::protobuf::Reflection>(pRVar2);
      pCVar1->reflection = pRVar2;
    }
  }
  for (iVar4 = 0; iVar4 < descriptor->enum_type_count_; iVar4 = iVar4 + 1) {
    pEVar3 = Descriptor::enum_type(descriptor,iVar4);
    *this->file_level_enum_descriptors_ = pEVar3;
    this->file_level_enum_descriptors_ = this->file_level_enum_descriptors_ + 1;
  }
  this->schemas_ = this->schemas_ + 1;
  this->default_instance_data_ = this->default_instance_data_ + 1;
  return;
}

Assistant:

void AssignMessageDescriptor(const Descriptor* descriptor) {
    for (int i = 0; i < descriptor->nested_type_count(); i++) {
      AssignMessageDescriptor(descriptor->nested_type(i));
    }

    // If there is no default instance we only want to initialize the descriptor
    // without updating the reflection.
    if (default_instance_data_[0] != nullptr) {
      auto& class_data = default_instance_data_[0]->GetClassData()->full();
      // If there is no descriptor_table in the class data, then it is not
      // interested in receiving reflection information either.
      if (class_data.descriptor_table != nullptr) {
        class_data.descriptor = descriptor;

        class_data.reflection = OnShutdownDelete(new Reflection(
            descriptor,
            MigrationToReflectionSchema(default_instance_data_, offsets_,
                                        *schemas_),
            DescriptorPool::internal_generated_pool(), factory_));
      }
    }
    for (int i = 0; i < descriptor->enum_type_count(); i++) {
      AssignEnumDescriptor(descriptor->enum_type(i));
    }
    schemas_++;
    default_instance_data_++;
  }